

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

void __thiscall
kj::_::LogExpectation::LogExpectation(LogExpectation *this,LogSeverity severity,StringPtr substring)

{
  LogSeverity severity_local;
  LogExpectation *this_local;
  StringPtr substring_local;
  
  ExceptionCallback::ExceptionCallback(&this->super_ExceptionCallback);
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__LogExpectation_00da1740;
  this->severity = severity;
  (this->substring).content.ptr = substring.content.ptr;
  (this->substring).content.size_ = substring.content.size_;
  this->seen = false;
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

LogExpectation::LogExpectation(LogSeverity severity, StringPtr substring)
    : severity(severity), substring(substring), seen(false) {}